

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

uint lws_retry_get_delay_ms(lws_context *context,lws_retry_bo_t *retry,uint16_t *ctry,char *conceal)

{
  uint uVar1;
  size_t sVar2;
  ushort local_3a;
  ulong uStack_38;
  uint16_t ra;
  uint64_t pc;
  uint64_t ms;
  char *conceal_local;
  uint16_t *ctry_local;
  lws_retry_bo_t *retry_local;
  lws_context *context_local;
  
  pc = 3000;
  uStack_38 = 0x1e;
  if (conceal != (char *)0x0) {
    *conceal = '\0';
  }
  if (retry != (lws_retry_bo_t *)0x0) {
    if (*ctry < retry->retry_ms_table_count) {
      uVar1 = retry->retry_ms_table[*ctry];
    }
    else {
      uVar1 = retry->retry_ms_table[(int)(retry->retry_ms_table_count - 1)];
    }
    pc = (uint64_t)uVar1;
    if (retry->jitter_percent != '\0') {
      uStack_38 = (ulong)retry->jitter_percent;
    }
  }
  ms = (uint64_t)conceal;
  conceal_local = (char *)ctry;
  ctry_local = (uint16_t *)retry;
  retry_local = (lws_retry_bo_t *)context;
  sVar2 = lws_get_random(context,&local_3a,2);
  if (sVar2 != 2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/network.c"
                  ,0x18c,
                  "unsigned int lws_retry_get_delay_ms(struct lws_context *, const lws_retry_bo_t *, uint16_t *, char *)"
                 );
  }
  if (*(short *)conceal_local != -1) {
    *(short *)conceal_local = *(short *)conceal_local + 1;
  }
  if ((ctry_local != (uint16_t *)0x0) && (ms != 0)) {
    *(bool *)ms = *(ushort *)conceal_local <= ctry_local[5];
  }
  return (int)((pc * uStack_38 * (ulong)local_3a) / 0x640000) + (int)pc;
}

Assistant:

unsigned int
lws_retry_get_delay_ms(struct lws_context *context,
		       const lws_retry_bo_t *retry, uint16_t *ctry,
		       char *conceal)
{
	uint64_t ms = 3000, pc = 30; /* sane-ish defaults if no retry table */
	uint16_t ra;

	if (conceal)
		*conceal = 0;

	if (retry) {
		if (*ctry < retry->retry_ms_table_count)
			ms = retry->retry_ms_table[*ctry];
		else
			ms = retry->retry_ms_table[
				retry->retry_ms_table_count - 1];

		/* if no percent given, use the default 30% */
		if (retry->jitter_percent)
			pc = retry->jitter_percent;
	}

	if (lws_get_random(context, &ra, sizeof(ra)) == sizeof(ra))
		ms += ((ms * pc * ra) >> 16) / 100;
	else
		assert(0);

	if (*ctry < 0xffff)
		(*ctry)++;

	if (retry && conceal)
		*conceal = (int)*ctry <= retry->conceal_count;

	return (unsigned int)ms;
}